

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnSelectExpr(BinaryReaderIR *this,Type result_type)

{
  Result RVar1;
  Enum local_4c;
  Expr *local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = result_type.enum_;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_38,&local_4c);
  MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((wabt *)&local_48,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_38);
  local_40._M_head_impl = local_48;
  local_48 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_48 != (Expr *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  local_48 = (Expr *)0x0;
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_38);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Type result_type) {
  return AppendExpr(MakeUnique<SelectExpr>(TypeVector{result_type}));
}